

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall ddd::DaTrie<false,_true,_true>::DaTrie(DaTrie<false,_true,_true> *this)

{
  pointer pBVar1;
  
  (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->head_pos_ = 0xffffffff;
  this->bc_emps_ = 0;
  this->tail_emps_ = 0;
  fix_(this,0,&this->blocks_);
  *(undefined4 *)
   (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data
   ._M_start = 0x7fffffff;
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pBVar1 = (Bc)((ulong)*pBVar1 | 0x7fffffff00000000);
  return;
}

Assistant:

DaTrie() {
    if (Prefix) {
      fix_(ROOT_POS, blocks_);
      bc_[ROOT_POS].set_base(INVALID_VALUE);
      bc_[ROOT_POS].set_check(INVALID_VALUE);
    }
  }